

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

Direction * __thiscall
entityx::EntityManager::get_component_ptr<Direction>(EntityManager *this,Id id)

{
  long lVar1;
  Family FVar2;
  
  FVar2 = Component<Direction>::family();
  lVar1 = *(long *)(*(long *)(this + 0x18) + FVar2 * 8);
  return (Direction *)
         (((id.id_ & 0xffffffff) % *(ulong *)(lVar1 + 0x28)) * *(long *)(lVar1 + 0x20) +
         *(long *)(*(long *)(lVar1 + 8) + ((id.id_ & 0xffffffff) / *(ulong *)(lVar1 + 0x28)) * 8));
}

Assistant:

C *get_component_ptr(Entity::Id id) {
    assert(valid(id));
    BasePool *pool = component_pools_[component_family<C>()];
    assert(pool);
    return static_cast<C*>(pool->get(id.index()));
  }